

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::BasicOutputTypesTest::test_method(BasicOutputTypesTest *this)

{
  key_type *__k;
  OutputType out_type;
  long lVar1;
  undefined1 auVar2 [16];
  mapped_type_conflict5 *pmVar3;
  mapped_type *pmVar4;
  char *coinControl;
  iterator pvVar5;
  undefined ***pppuVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined4 in_stack_fffffffffffffea8;
  key_type in_stack_fffffffffffffeac;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  key_type local_11c;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  ulong local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined2 local_c8;
  undefined1 local_c6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  CoinsResult available_coins;
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  expected_coins_sizes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
    pmVar3 = std::
             map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
             ::operator[](&expected_coins_sizes,(key_type *)((long)OUTPUT_TYPES._M_elems + lVar8));
    *pmVar3 = 0;
  }
  available_coins.coins._M_t._M_impl._0_4_ = 4;
  pmVar3 = std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[](&expected_coins_sizes,(key_type *)&available_coins);
  *pmVar3 = 1;
  coinControl = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock61,
             &((this->super_ListCoinsTest).super_ListCoinsTestingSetup.wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet,
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x2bd,false);
  pppuVar6 = &local_e8;
  local_e8 = (undefined **)0x1;
  local_e0 = 2100000000000000;
  local_d8 = (undefined1 *)0x775f05a074000;
  local_d0 = (char *)0x0;
  local_c8 = 1;
  local_c6 = 1;
  pvVar5 = (iterator)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pppuVar6;
  AvailableCoins(&available_coins,
                 (wallet *)
                 (this->super_ListCoinsTest).super_ListCoinsTestingSetup.wallet._M_t.
                 super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                 super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                 super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CWallet *)0x0,
                 (CCoinControl *)coinControl,(optional<CFeeRate>)(auVar2 << 0x40),
                 (CoinFilterParams *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock61.super_unique_lock);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)pppuVar6;
  msg.m_begin = pvVar5;
  file.m_end = (iterator)0x2be;
  file.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  local_e0 = local_e0 & 0xffffffffffffff00;
  local_e8 = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_110 = "";
  criticalblock61.super_unique_lock._M_device = (mutex_type *)CoinsResult::Size(&available_coins);
  local_11c = UNKNOWN;
  pmVar3 = std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[](&expected_coins_sizes,&local_11c);
  pvVar5 = (iterator)0x2;
  pUVar7 = &criticalblock61;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_e8,&local_118,0x2be,1,2,pUVar7,"available_coins.Size()",pmVar3,
             "expected_coins_sizes[OutputType::UNKNOWN]");
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pUVar7;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x2bf;
  file_00.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_e0 = local_e0 & 0xffffffffffffff00;
  local_e8 = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_148 = "";
  local_11c = UNKNOWN;
  pmVar4 = std::
           map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           ::operator[](&available_coins.coins,&local_11c);
  criticalblock61.super_unique_lock._M_device =
       (mutex_type *)
       (((long)(pmVar4->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(pmVar4->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0xa0);
  pmVar3 = std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[](&expected_coins_sizes,(key_type *)&stack0xfffffffffffffeac);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_e8,&local_150,0x2bf,1,2,&criticalblock61,
             "available_coins.coins[OutputType::UNKNOWN].size()",pmVar3,
             "expected_coins_sizes[OutputType::UNKNOWN]");
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
    __k = (key_type *)((long)OUTPUT_TYPES._M_elems + lVar8);
    out_type = *__k;
    if (out_type != UNKNOWN) {
      pmVar3 = std::
               map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
               ::operator[](&expected_coins_sizes,__k);
      *pmVar3 = 2;
      TestCoinsResult(&this->super_ListCoinsTest,out_type,100000000,&expected_coins_sizes);
    }
  }
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_unsigned_long>,_std::_Select1st<std::pair<const_OutputType,_unsigned_long>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  ::~_Rb_tree(&expected_coins_sizes._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(BasicOutputTypesTest, ListCoinsTest)
{
    std::map<OutputType, size_t> expected_coins_sizes;
    for (const auto& out_type : OUTPUT_TYPES) { expected_coins_sizes[out_type] = 0U; }

    // Verify our wallet has one usable coinbase UTXO before starting
    // This UTXO is a P2PK, so it should show up in the Other bucket
    expected_coins_sizes[OutputType::UNKNOWN] = 1U;
    CoinsResult available_coins = WITH_LOCK(wallet->cs_wallet, return AvailableCoins(*wallet));
    BOOST_CHECK_EQUAL(available_coins.Size(), expected_coins_sizes[OutputType::UNKNOWN]);
    BOOST_CHECK_EQUAL(available_coins.coins[OutputType::UNKNOWN].size(), expected_coins_sizes[OutputType::UNKNOWN]);

    // We will create a self transfer for each of the OutputTypes and
    // verify it is put in the correct bucket after running GetAvailablecoins
    //
    // For each OutputType, We expect 2 UTXOs in our wallet following the self transfer:
    //   1. One UTXO as the recipient
    //   2. One UTXO from the change, due to payment address matching logic

    for (const auto& out_type : OUTPUT_TYPES) {
        if (out_type == OutputType::UNKNOWN) continue;
        expected_coins_sizes[out_type] = 2U;
        TestCoinsResult(*this, out_type, 1 * COIN, expected_coins_sizes);
    }
}